

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

void djb::brdf::io_to_hd(vec3 *wi,vec3 *wo,vec3 *wh,vec3 *wd)

{
  vec3 vVar1;
  undefined8 local_e0;
  float_t local_d8;
  vec3 local_d0;
  vec3 local_c0 [2];
  vec3 local_a8;
  undefined1 local_98 [8];
  vec3 tmp;
  undefined4 uStack_84;
  float_t local_80;
  vec3 local_78;
  vec3 local_68;
  undefined8 local_58;
  float_t local_50;
  float_t local_48;
  float_t local_44;
  float_t phi_h;
  float_t theta_h;
  vec3 z;
  vec3 y;
  vec3 *wd_local;
  vec3 *wh_local;
  vec3 *wo_local;
  vec3 *wi_local;
  
  vec3::vec3((vec3 *)&z.y,0.0,1.0,0.0);
  vec3::vec3((vec3 *)&phi_h,0.0,0.0,1.0);
  vVar1 = djb::operator+(wi,wo);
  local_78.z = vVar1.z;
  local_68.z = local_78.z;
  local_78._0_8_ = vVar1._0_8_;
  local_68.x = local_78.x;
  local_68.y = local_78.y;
  vVar1 = normalize(&local_68);
  local_80 = vVar1.z;
  local_50 = local_80;
  stack0xffffffffffffff78 = vVar1._0_8_;
  local_58 = stack0xffffffffffffff78;
  wh->z = local_80;
  wh->x = tmp.z;
  wh->y = (float_t)uStack_84;
  unique0x100001fc = vVar1;
  xyz_to_theta_phi(wh,&local_44,&local_48);
  vVar1 = rotate_vector(wi,(vec3 *)&phi_h,-local_48);
  local_a8.z = vVar1.z;
  tmp.x = local_a8.z;
  local_a8._0_8_ = vVar1._0_8_;
  local_98._0_4_ = local_a8.x;
  local_98._4_4_ = local_a8.y;
  local_a8 = vVar1;
  vVar1 = rotate_vector((vec3 *)local_98,(vec3 *)&z.y,-local_44);
  local_d0.z = vVar1.z;
  local_c0[0].z = local_d0.z;
  local_d0._0_8_ = vVar1._0_8_;
  local_c0[0].x = local_d0.x;
  local_c0[0].y = local_d0.y;
  vVar1 = normalize(local_c0);
  local_e0 = vVar1._0_8_;
  local_d8 = vVar1.z;
  wd->x = (float_t)(undefined4)local_e0;
  wd->y = (float_t)local_e0._4_4_;
  wd->z = local_d8;
  return;
}

Assistant:

void brdf::io_to_hd(const vec3 &wi, const vec3 &wo, vec3 *wh, vec3 *wd)
{
	const vec3 y = vec3(0, 1, 0);
	const vec3 z = vec3(0, 0, 1);
	float_t theta_h, phi_h;

	(*wh) = normalize(wi + wo);
	xyz_to_theta_phi(*wh, &theta_h, &phi_h);
	vec3 tmp = rotate_vector(wi, z, -phi_h);
	(*wd) = normalize(rotate_vector(tmp, y, -theta_h));
}